

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O0

SharedPtr<Decorator> __thiscall
Rml::DecoratorConicGradientInstancer::InstanceDecorator
          (DecoratorConicGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  bool bVar1;
  Property *this_00;
  reference ppPVar2;
  NumericValue value;
  element_type *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Property *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  float in_angle;
  Vector2Numeric in_position;
  SharedPtr<Decorator> SVar4;
  Array<const_Property_*,_2> p_position_00;
  undefined1 local_a0 [8];
  SharedPtr<Rml::DecoratorConicGradient> decorator;
  ColorStopList *color_stop_list;
  bool repeating;
  Vector2Numeric position;
  float angle;
  Property *p_color_stop_list;
  Array<const_Property_*,_2> p_position;
  Property *p_angle;
  DecoratorInstancerInterface *param_3_local;
  PropertyDictionary *properties__local;
  String *name_local;
  DecoratorConicGradientInstancer *this_local;
  
  p_position._M_elems[1] =
       PropertyDictionary::GetProperty
                 ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  p_color_stop_list =
       PropertyDictionary::GetProperty
                 ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  p_position._M_elems[0] =
       PropertyDictionary::GetProperty
                 ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  if (p_position._M_elems[1] != (Property *)0x0) {
    ppPVar2 = ::std::array<const_Rml::Property_*,_2UL>::operator[]
                        ((array<const_Rml::Property_*,_2UL> *)&p_color_stop_list,0);
    if (*ppPVar2 != (value_type)0x0) {
      ppPVar2 = ::std::array<const_Rml::Property_*,_2UL>::operator[]
                          ((array<const_Rml::Property_*,_2UL> *)&p_color_stop_list,1);
      if ((*ppPVar2 != (value_type)0x0) && (this_00 != (Property *)0x0)) {
        value = Property::GetNumericValue(p_position._M_elems[1]);
        in_angle = ComputeAngle(value);
        p_position_00._M_elems[1] = extraout_RDX_00;
        p_position_00._M_elems[0] = p_position._M_elems[0];
        in_position = ComputePosition((Rml *)p_color_stop_list,p_position_00);
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)properties_,"repeating-conic-gradient");
        if (this_00->unit == COLORSTOPLIST) {
          decorator.super___shared_ptr<Rml::DecoratorConicGradient,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               Variant::GetReference<std::vector<Rml::ColorStop,std::allocator<Rml::ColorStop>>>
                         (&this_00->value);
          MakeShared<Rml::DecoratorConicGradient>();
          this_01 = ::std::
                    __shared_ptr_access<Rml::DecoratorConicGradient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<Rml::DecoratorConicGradient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_a0);
          bVar1 = DecoratorConicGradient::Initialise
                            (this_01,bVar1,in_angle,in_position,
                             (ColorStopList *)
                             decorator.
                             super___shared_ptr<Rml::DecoratorConicGradient,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
          if (bVar1) {
            ::std::shared_ptr<Rml::Decorator>::shared_ptr<Rml::DecoratorConicGradient,void>
                      ((shared_ptr<Rml::Decorator> *)this,
                       (shared_ptr<Rml::DecoratorConicGradient> *)local_a0);
          }
          else {
            ::std::shared_ptr<Rml::Decorator>::shared_ptr
                      ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
          }
          ::std::shared_ptr<Rml::DecoratorConicGradient>::~shared_ptr
                    ((shared_ptr<Rml::DecoratorConicGradient> *)local_a0);
          _Var3._M_pi = extraout_RDX_02;
        }
        else {
          ::std::shared_ptr<Rml::Decorator>::shared_ptr
                    ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
          _Var3._M_pi = extraout_RDX_01;
        }
        goto LAB_0052940a;
      }
    }
  }
  ::std::shared_ptr<Rml::Decorator>::shared_ptr((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
  _Var3._M_pi = extraout_RDX;
LAB_0052940a:
  SVar4.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  SVar4.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar4.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorConicGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_angle = properties_.GetProperty(ids.angle);
	Array<const Property*, 2> p_position = {properties_.GetProperty(ids.position_x), properties_.GetProperty(ids.position_y)};
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_angle || !p_position[0] || !p_position[1] || !p_color_stop_list)
		return nullptr;

	const float angle = ComputeAngle(p_angle->GetNumericValue());
	const Vector2Numeric position = ComputePosition(p_position);
	const bool repeating = (name == "repeating-conic-gradient");

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();

	auto decorator = MakeShared<DecoratorConicGradient>();
	if (decorator->Initialise(repeating, angle, position, color_stop_list))
		return decorator;

	return nullptr;
}